

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O3

void __thiscall
cmDebugger::cmDebuggerAdapter::OnBeginFunctionCall
          (cmDebuggerAdapter *this,cmMakefile *mf,string *sourcePath,cmListFileFunction *lff)

{
  long line;
  Session *pSVar1;
  pointer plVar2;
  pointer plVar3;
  int iVar4;
  long *plVar5;
  element_type *peVar6;
  TypeInfo *pTVar7;
  Semaphore *pSVar8;
  array<dap::integer> hitBreakpoints;
  vector<long,_std::allocator<long>_> hits;
  unique_lock<std::mutex> lock;
  vector<dap::integer,_std::allocator<dap::integer>_> local_128;
  vector<long,_std::allocator<long>_> local_108;
  unique_lock<std::mutex> local_f0;
  undefined2 local_e0 [4];
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined1 local_b8;
  vector<dap::integer,_std::allocator<dap::integer>_> local_b0;
  undefined1 local_98;
  undefined2 local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined1 local_48;
  int64_t local_40;
  undefined1 local_38;
  
  local_f0._M_device = &this->Mutex;
  local_f0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_f0);
  local_f0._M_owns = true;
  cmDebuggerThread::PushStackFrame
            ((this->DefaultThread).
             super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr,mf,
             sourcePath,lff);
  line = ((lff->Impl).
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->Line;
  if (line == 0) goto LAB_00489c22;
  cmDebuggerBreakpointManager::GetBreakpoints
            (&local_108,
             (this->BreakpointManager)._M_t.
             super___uniq_ptr_impl<cmDebugger::cmDebuggerBreakpointManager,_std::default_delete<cmDebugger::cmDebuggerBreakpointManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::cmDebuggerBreakpointManager_*,_std::default_delete<cmDebugger::cmDebuggerBreakpointManager>_>
             .super__Head_base<0UL,_cmDebugger::cmDebuggerBreakpointManager_*,_false>._M_head_impl,
             sourcePath,line);
  std::unique_lock<std::mutex>::unlock(&local_f0);
  plVar3 = local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  plVar2 = local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  local_d0 = 0;
  local_c8 = 0;
  local_b8 = 0;
  local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_98 = 0;
  local_90 = 0;
  local_80 = (char *)0x0;
  local_78 = 0;
  local_60 = 0;
  local_58 = 0;
  local_48 = 0;
  local_e0[0] = 0x101;
  peVar6 = (this->DefaultThread).
           super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = peVar6->Id;
  local_38 = 1;
  local_d8 = &local_c8;
  local_88 = &local_78;
  local_68 = &local_58;
  if (local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    LOCK();
    (this->NextStepFrom).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->StepInRequest)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->StepOutDepth).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->PauseRequest)._M_base._M_i = false;
    UNLOCK();
    local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<dap::integer,_std::allocator<dap::integer>_>::resize
              (&local_128,
               (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    pSVar8 = (Semaphore *)
             local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (plVar5 = local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        plVar5 != local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish; plVar5 = plVar5 + 1) {
      (pSVar8->Mutex).super___mutex_base._M_mutex.__align = *plVar5;
      pSVar8 = (Semaphore *)((long)&(pSVar8->Mutex).super___mutex_base._M_mutex + 8);
    }
    std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x8bd051);
    std::vector<dap::integer,_std::allocator<dap::integer>_>::operator=(&local_b0,&local_128);
    local_98 = 1;
    if ((Semaphore *)
        local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
        super__Vector_impl_data._M_start != (Semaphore *)0x0) {
      operator_delete(local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.
                            super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.
                            super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    peVar6 = (this->DefaultThread).
             super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((((this->NextStepFrom).super___atomic_base<long>._M_i <
        (long)(peVar6->Frames).
              super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(peVar6->Frames).
              super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4) &&
      (((this->StepInRequest)._M_base._M_i & 1U) == 0)) &&
     (peVar6 = (this->DefaultThread).
               super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     (this->StepOutDepth).super___atomic_base<long>._M_i <
     (long)(peVar6->Frames).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
           ._M_impl.super__Vector_impl_data._M_finish -
     (long)(peVar6->Frames).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
           ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    if (((this->PauseRequest)._M_base._M_i & 1U) != 0) {
LAB_00489af4:
      LOCK();
      (this->NextStepFrom).super___atomic_base<long>._M_i = -0x80000000;
      UNLOCK();
      LOCK();
      (this->StepInRequest)._M_base._M_i = false;
      UNLOCK();
      LOCK();
      (this->StepOutDepth).super___atomic_base<long>._M_i = -0x80000000;
      UNLOCK();
      LOCK();
      (this->PauseRequest)._M_base._M_i = false;
      UNLOCK();
      std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x8bd05c);
      goto LAB_00489b41;
    }
    if (plVar2 != plVar3) goto LAB_00489b41;
  }
  else {
    LOCK();
    (this->NextStepFrom).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->StepInRequest)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->StepOutDepth).super___atomic_base<long>._M_i = -0x80000000;
    UNLOCK();
    LOCK();
    (this->PauseRequest)._M_base._M_i = false;
    UNLOCK();
    std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x8c3df6);
    if (((this->PauseRequest)._M_base._M_i & 1U) != 0) goto LAB_00489af4;
LAB_00489b41:
    pSVar1 = (this->Session)._M_t.
             super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
             super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
             super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
    pTVar7 = dap::TypeOf<dap::StoppedEvent>::type();
    (*pSVar1->_vptr_Session[0xb])(pSVar1,pTVar7,local_e0);
    pSVar8 = (this->ContinueSem)._M_t.
             super___uniq_ptr_impl<cmDebugger::Semaphore,_std::default_delete<cmDebugger::Semaphore>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::Semaphore_*,_std::default_delete<cmDebugger::Semaphore>_>
             .super__Head_base<0UL,_cmDebugger::Semaphore_*,_false>._M_head_impl;
    local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pSVar8;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_128);
    local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_128.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
    iVar4 = pSVar8->Count;
    if (iVar4 == 0) {
      do {
        std::condition_variable::wait((unique_lock *)&pSVar8->Cv);
        iVar4 = pSVar8->Count;
      } while (iVar4 == 0);
    }
    pSVar8->Count = iVar4 + -1;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_128);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if (local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    CONCAT71(local_b0.
                             super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_b0.
                             super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_b0.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if (local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00489c22:
  std::unique_lock<std::mutex>::~unique_lock(&local_f0);
  return;
}

Assistant:

void cmDebuggerAdapter::OnBeginFunctionCall(cmMakefile* mf,
                                            std::string const& sourcePath,
                                            cmListFileFunction const& lff)
{
  std::unique_lock<std::mutex> lock(Mutex);
  DefaultThread->PushStackFrame(mf, sourcePath, lff);

  if (lff.Line() == 0) {
    // File just loaded, continue to first valid function call.
    return;
  }

  auto hits = BreakpointManager->GetBreakpoints(sourcePath, lff.Line());
  lock.unlock();

  bool waitSem = false;
  dap::StoppedEvent stoppedEvent;
  stoppedEvent.allThreadsStopped = true;
  stoppedEvent.threadId = DefaultThread->GetId();
  if (!hits.empty()) {
    ClearStepRequests();
    waitSem = true;

    dap::array<dap::integer> hitBreakpoints;
    hitBreakpoints.resize(hits.size());
    std::transform(hits.begin(), hits.end(), hitBreakpoints.begin(),
                   [&](const int64_t& id) { return dap::integer(id); });
    stoppedEvent.reason = "breakpoint";
    stoppedEvent.hitBreakpointIds = hitBreakpoints;
  }

  if (long(DefaultThread->GetStackFrameSize()) <= NextStepFrom.load() ||
      StepInRequest.load() ||
      long(DefaultThread->GetStackFrameSize()) <= StepOutDepth.load()) {
    ClearStepRequests();
    waitSem = true;

    stoppedEvent.reason = "step";
  }

  if (PauseRequest.load()) {
    ClearStepRequests();
    waitSem = true;

    stoppedEvent.reason = "pause";
  }

  if (waitSem) {
    Session->send(stoppedEvent);
    ContinueSem->Wait();
  }
}